

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.h
# Opt level: O2

void __thiscall
slang::ast::RandCaseStatement::visitStmts<xilinx_do_not_care_values::MainVisitor&>
          (RandCaseStatement *this,AlwaysFFVisitor *visitor)

{
  Item *item;
  pointer pIVar1;
  long lVar2;
  
  pIVar1 = (this->items)._M_ptr;
  for (lVar2 = (this->items)._M_extent._M_extent_value << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    Statement::visit<xilinx_do_not_care_values::MainVisitor&>((pIVar1->stmt).ptr,visitor);
    pIVar1 = pIVar1 + 1;
  }
  return;
}

Assistant:

void visitStmts(TVisitor&& visitor) const {
        for (auto& item : items)
            item.stmt->visit(visitor);
    }